

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendstate.c
# Opt level: O1

int quicly_sendstate_activate(quicly_sendstate_t *state)

{
  size_t sVar1;
  int iVar2;
  uint64_t uVar3;
  uint64_t end;
  
  sVar1 = (state->pending).num_ranges;
  uVar3 = state->final_size + 1;
  end = 0xffffffffffffffff;
  if (uVar3 != 0) {
    end = uVar3;
  }
  if ((sVar1 != 0) && ((state->pending).ranges[sVar1 - 1].end == end)) {
    return 0;
  }
  iVar2 = quicly_ranges_add(&state->pending,state->size_inflight,end);
  return iVar2;
}

Assistant:

int quicly_sendstate_activate(quicly_sendstate_t *state)
{
    uint64_t end_off = state->final_size;

    /* take EOS position into account */
    if (end_off != UINT64_MAX)
        ++end_off;

    /* do nothing if already active */
    if (state->pending.num_ranges != 0 && state->pending.ranges[state->pending.num_ranges - 1].end == end_off)
        return 0;

    return quicly_ranges_add(&state->pending, state->size_inflight, end_off);
}